

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * __thiscall
FSerializer::Sprite(FSerializer *this,char *key,int32_t *spritenum,int32_t *def)

{
  uint uVar1;
  FWriter *pFVar2;
  char cVar3;
  Value *this_00;
  Ch *cc;
  DWORD *pDVar4;
  ulong uVar5;
  spritedef_t *psVar6;
  
  pFVar2 = this->w;
  if (pFVar2 == (FWriter *)0x0) {
    this_00 = FReader::FindKey(this->r,key);
    if ((this_00 != (Value *)0x0) && ((*(byte *)((long)&this_00->data_ + 0x17) & 4) != 0)) {
      cc = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
      pDVar4 = (DWORD *)UnicodeToString(cc);
      psVar6 = sprites.Array + NumStdSprites;
      uVar5 = 0;
      do {
        psVar6 = psVar6 + -1;
        if (NumStdSprites == uVar5) {
          return this;
        }
        uVar5 = uVar5 + 1;
      } while ((psVar6->field_0).dwName != *pDVar4);
      *spritenum = NumStdSprites - (int)uVar5;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if (uVar1 == 0) {
      cVar3 = '\0';
    }
    else {
      cVar3 = (pFVar2->mInObject).Array[uVar1 - 1];
    }
    if (((def == (int32_t *)0x0) || (cVar3 == '\0')) || (*def != *spritenum)) {
      WriteKey(this,key);
      FWriter::String(this->w,(char *)(sprites.Array + *spritenum),4);
    }
  }
  return this;
}

Assistant:

FSerializer &FSerializer::Sprite(const char *key, int32_t &spritenum, int32_t *def)
{
	if (isWriting())
	{
		if (w->inObject() && def != nullptr && *def == spritenum) return *this;
		WriteKey(key);
		w->String(sprites[spritenum].name, 4);
	}
	else
	{
		auto val = r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				uint32_t name = *reinterpret_cast<const uint32_t*>(UnicodeToString(val->GetString()));
				for (auto hint = NumStdSprites; hint-- != 0; )
				{
					if (sprites[hint].dwName == name)
					{
						spritenum = hint;
						break;
					}
				}
			}
		}
	}
	return *this;
}